

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

char * glslang::TQualifier::getLayoutStencilString(TLayoutStencil s)

{
  char *pcStack_10;
  TLayoutStencil s_local;
  
  switch(s) {
  case ElsRefUnchangedFrontAMD:
    pcStack_10 = "stencil_ref_unchanged_front_amd";
    break;
  case ElsRefGreaterFrontAMD:
    pcStack_10 = "stencil_ref_greater_front_amd";
    break;
  case ElsRefLessFrontAMD:
    pcStack_10 = "stencil_ref_less_front_amd";
    break;
  case ElsRefUnchangedBackAMD:
    pcStack_10 = "stencil_ref_unchanged_back_amd";
    break;
  case ElsRefGreaterBackAMD:
    pcStack_10 = "stencil_ref_greater_back_amd";
    break;
  case ElsRefLessBackAMD:
    pcStack_10 = "stencil_ref_less_back_amd";
    break;
  default:
    pcStack_10 = "none";
  }
  return pcStack_10;
}

Assistant:

static const char* getLayoutStencilString(TLayoutStencil s)
    {
        switch (s) {
        case ElsRefUnchangedFrontAMD: return "stencil_ref_unchanged_front_amd";
        case ElsRefGreaterFrontAMD:   return "stencil_ref_greater_front_amd";
        case ElsRefLessFrontAMD:      return "stencil_ref_less_front_amd";
        case ElsRefUnchangedBackAMD:  return "stencil_ref_unchanged_back_amd";
        case ElsRefGreaterBackAMD:    return "stencil_ref_greater_back_amd";
        case ElsRefLessBackAMD:       return "stencil_ref_less_back_amd";
        default:                      return "none";
        }
    }